

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

ContentEncoding * __thiscall
mkvparser::Track::GetContentEncodingByIndex(Track *this,unsigned_long idx)

{
  ptrdiff_t count;
  unsigned_long idx_local;
  Track *this_local;
  ContentEncoding *local_8;
  
  if (idx < (ulong)((long)this->content_encoding_entries_end_ -
                    (long)this->content_encoding_entries_ >> 3)) {
    local_8 = this->content_encoding_entries_[idx];
  }
  else {
    local_8 = (ContentEncoding *)0x0;
  }
  return local_8;
}

Assistant:

const ContentEncoding* Track::GetContentEncodingByIndex(
    unsigned long idx) const {
  const ptrdiff_t count =
      content_encoding_entries_end_ - content_encoding_entries_;
  assert(count >= 0);

  if (idx >= static_cast<unsigned long>(count))
    return NULL;

  return content_encoding_entries_[idx];
}